

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_mp3_read_pcm_frames_f32(ma_dr_mp3 *pMP3,ma_uint64 framesToRead,float *pBufferOut)

{
  uint uVar1;
  ulong uVar2;
  ma_uint64 mVar3;
  ma_uint64 totalPCMFramesRead;
  ma_uint64 mVar4;
  ulong framesToRead_00;
  long lVar5;
  ma_int16 pTempS16 [8192];
  short local_4028 [8192];
  
  if ((pMP3 == (ma_dr_mp3 *)0x0) || (pMP3->onRead == (ma_dr_mp3_read_proc)0x0)) {
    mVar4 = 0;
  }
  else {
    for (mVar4 = 0; framesToRead_00 = framesToRead - mVar4,
        mVar4 <= framesToRead && framesToRead_00 != 0; mVar4 = mVar4 + mVar3) {
      uVar2 = 0x2000 / (ulong)pMP3->channels;
      if (uVar2 <= framesToRead_00) {
        framesToRead_00 = uVar2;
      }
      mVar3 = ma_dr_mp3_read_pcm_frames_raw(pMP3,framesToRead_00,local_4028);
      if (mVar3 == 0) {
        return mVar4;
      }
      uVar1 = pMP3->channels;
      for (lVar5 = 0; uVar1 * mVar3 - lVar5 != 0; lVar5 = lVar5 + 1) {
        pBufferOut[mVar4 * uVar1 + lVar5] = (float)(int)local_4028[lVar5] * 3.0517578e-05;
      }
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_uint64 ma_dr_mp3_read_pcm_frames_f32(ma_dr_mp3* pMP3, ma_uint64 framesToRead, float* pBufferOut)
{
    if (pMP3 == NULL || pMP3->onRead == NULL) {
        return 0;
    }
#if defined(MA_DR_MP3_FLOAT_OUTPUT)
    return ma_dr_mp3_read_pcm_frames_raw(pMP3, framesToRead, pBufferOut);
#else
    {
        ma_int16 pTempS16[8192];
        ma_uint64 totalPCMFramesRead = 0;
        while (totalPCMFramesRead < framesToRead) {
            ma_uint64 framesJustRead;
            ma_uint64 framesRemaining = framesToRead - totalPCMFramesRead;
            ma_uint64 framesToReadNow = MA_DR_MP3_COUNTOF(pTempS16) / pMP3->channels;
            if (framesToReadNow > framesRemaining) {
                framesToReadNow = framesRemaining;
            }
            framesJustRead = ma_dr_mp3_read_pcm_frames_raw(pMP3, framesToReadNow, pTempS16);
            if (framesJustRead == 0) {
                break;
            }
            ma_dr_mp3_s16_to_f32((float*)MA_DR_MP3_OFFSET_PTR(pBufferOut, sizeof(float) * totalPCMFramesRead * pMP3->channels), pTempS16, framesJustRead * pMP3->channels);
            totalPCMFramesRead += framesJustRead;
        }
        return totalPCMFramesRead;
    }
#endif
}